

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O1

int Gia_ManCountDepth(Gia_ManEra_t *p)

{
  uint uVar1;
  uint uVar2;
  void **ppvVar3;
  int iVar4;
  long lVar5;
  void *pvVar6;
  
  uVar1 = p->vStates->nSize;
  lVar5 = (long)(int)uVar1;
  if (lVar5 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
  }
  ppvVar3 = p->vStates->pArray;
  pvVar6 = ppvVar3[lVar5 + -1];
  if ((3 < (int)uVar1) && (*(int *)((long)pvVar6 + 8) == 0)) {
    pvVar6 = ppvVar3[lVar5 + -2];
  }
  iVar4 = 0;
  do {
    if (pvVar6 == (void *)0x0) {
      return iVar4;
    }
    uVar2 = *(uint *)((long)pvVar6 + 8);
    if ((ulong)uVar2 == 0) {
      pvVar6 = (void *)0x0;
    }
    else {
      if (uVar1 <= uVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar6 = ppvVar3[uVar2];
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

int Gia_ManCountDepth( Gia_ManEra_t * p )
{
    Gia_ObjEra_t * pState;
    int Counter = 0;
    pState = (Gia_ObjEra_t *)Vec_PtrEntryLast( p->vStates );
    if ( pState->iPrev == 0 && Vec_PtrSize(p->vStates) > 3 )
        pState = (Gia_ObjEra_t *)Vec_PtrEntry( p->vStates, Vec_PtrSize(p->vStates) - 2 );
    for ( ; pState; pState = pState->iPrev ? Gia_ManEraState(p, pState->iPrev) : NULL )
        Counter++;
    return Counter;
}